

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O1

edata_t * emap_try_acquire_edata_neighbor_impl
                    (tsdn_t *tsdn,emap_t *emap,edata_t *edata,extent_pai_t pai,
                    extent_state_t expected_state,_Bool forward,_Bool expanding)

{
  rtree_ctx_cache_elm_t *prVar1;
  void *pvVar2;
  rtree_leaf_elm_t *prVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  rtree_leaf_elm_t *prVar7;
  edata_t *edata_00;
  ulong uVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_ctx_cache_elm_t *prVar10;
  undefined7 in_register_00000089;
  rtree_ctx_t *ctx;
  bool bVar11;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t local_1b0;
  
  uVar4 = 0xfffffffffffff000;
  if ((int)CONCAT71(in_register_00000089,forward) != 0) {
    uVar4 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  }
  if (edata->e_addr != (void *)0x0) {
    uVar4 = ((ulong)edata->e_addr & 0xfffffffffffff000) + uVar4;
    if (tsdn == (tsdn_t *)0x0) {
      ctx = &local_1b0;
      duckdb_je_rtree_ctx_data_init(ctx);
    }
    else {
      ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    pvVar5 = (void *)(uVar4 & 0xffffffffc0000000);
    uVar6 = (ulong)(((uint)(uVar4 >> 0x1e) & 0xf) << 4);
    prVar7 = (rtree_leaf_elm_t *)((long)&ctx->cache[0].leafkey + uVar6);
    pvVar2 = *(void **)((long)&ctx->cache[0].leafkey + uVar6);
    if (pvVar2 == pvVar5) {
      prVar7 = (rtree_leaf_elm_t *)
               ((ulong)((uint)(uVar4 >> 9) & 0x1ffff8) + (long)prVar7[1].le_bits.repr);
    }
    else if ((void *)ctx->l2_cache[0].leafkey == pvVar5) {
      prVar3 = ctx->l2_cache[0].leaf;
      ctx->l2_cache[0].leafkey = (uintptr_t)pvVar2;
      ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar7[1].le_bits.repr;
      (prVar7->le_bits).repr = pvVar5;
      prVar7[1].le_bits.repr = prVar3;
      prVar7 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)uVar4 >> 9 & 0x1ffff8));
    }
    else {
      prVar9 = ctx->l2_cache + 1;
      if ((void *)ctx->l2_cache[1].leafkey == pvVar5) {
        uVar8 = 0;
        bVar11 = false;
      }
      else {
        uVar6 = 1;
        prVar10 = prVar9;
        do {
          uVar8 = uVar6;
          bVar11 = 6 < uVar8;
          if (uVar8 == 7) goto LAB_01c7f088;
          prVar9 = prVar10 + 1;
          prVar1 = prVar10 + 1;
          uVar6 = uVar8 + 1;
          prVar10 = prVar9;
        } while ((void *)prVar1->leafkey != pvVar5);
        bVar11 = 6 < uVar8;
      }
      prVar3 = prVar9->leaf;
      prVar9->leafkey = ctx->l2_cache[uVar8].leafkey;
      prVar9->leaf = ctx->l2_cache[uVar8].leaf;
      ctx->l2_cache[uVar8].leafkey = (uintptr_t)pvVar2;
      ctx->l2_cache[uVar8].leaf = (rtree_leaf_elm_t *)prVar7[1].le_bits.repr;
      (prVar7->le_bits).repr = pvVar5;
      prVar7[1].le_bits.repr = prVar3;
      prVar7 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)(uVar4 >> 9) & 0x1ffff8));
LAB_01c7f088:
      if (bVar11) {
        prVar7 = duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,ctx,uVar4,false,false);
      }
    }
    if (prVar7 != (rtree_leaf_elm_t *)0x0) {
      pvVar2 = (prVar7->le_bits).repr;
      edata_00 = (edata_t *)(((long)pvVar2 << 0x10) >> 0x10 & 0xffffffffffffff80);
      if (edata_00 != (edata_t *)0x0) {
        uVar4 = edata->e_bits;
        if (forward) {
          uVar6 = (ulong)pvVar2 & 2;
        }
        else {
          uVar6 = uVar4 >> 0x2c & 1;
        }
        if (uVar6 == 0) {
          if (pai == EXTENT_PAI_PAC) {
            if (((extent_state_t)((ulong)pvVar2 >> 2) &
                (extent_state_transition|extent_state_retained)) != expected_state) {
              return (edata_t *)0x0;
            }
            if ((!expanding) &&
               (((byte)(uVar4 >> 0xd) & 1) != (*(byte *)((long)&edata_00->e_bits + 1) & 0x20) >> 5))
            {
              return (edata_t *)0x0;
            }
          }
          else if (((ulong)pvVar2 >> 2 & 7) == 0) {
            return (edata_t *)0x0;
          }
          if ((((extent_pai_t)(edata_00->e_bits >> 0xe) & EXTENT_PAI_HPA) == pai) &&
             ((duckdb_je_opt_retain != false ||
              ((((uint)edata_00->e_bits ^ (uint)uVar4) & 0xfff) == 0)))) {
            duckdb_je_emap_update_edata_state(tsdn,emap,edata_00,extent_state_max);
            return edata_00;
          }
        }
      }
    }
  }
  return (edata_t *)0x0;
}

Assistant:

static inline edata_t *
emap_try_acquire_edata_neighbor_impl(tsdn_t *tsdn, emap_t *emap, edata_t *edata,
    extent_pai_t pai, extent_state_t expected_state, bool forward,
    bool expanding) {
	witness_assert_positive_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE);
	assert(!edata_guarded_get(edata));
	assert(!expanding || forward);
	assert(!edata_state_in_transition(expected_state));
	assert(expected_state == extent_state_dirty ||
	       expected_state == extent_state_muzzy ||
	       expected_state == extent_state_retained);

	void *neighbor_addr = forward ? edata_past_get(edata) :
	    edata_before_get(edata);
	/*
	 * This is subtle; the rtree code asserts that its input pointer is
	 * non-NULL, and this is a useful thing to check.  But it's possible
	 * that edata corresponds to an address of (void *)PAGE (in practice,
	 * this has only been observed on FreeBSD when address-space
	 * randomization is on, but it could in principle happen anywhere).  In
	 * this case, edata_before_get(edata) is NULL, triggering the assert.
	 */
	if (neighbor_addr == NULL) {
		return NULL;
	}

	EMAP_DECLARE_RTREE_CTX;
	rtree_leaf_elm_t *elm = rtree_leaf_elm_lookup(tsdn, &emap->rtree,
	    rtree_ctx, (uintptr_t)neighbor_addr, /* dependent*/ false,
	    /* init_missing */ false);
	if (elm == NULL) {
		return NULL;
	}

	rtree_contents_t neighbor_contents = rtree_leaf_elm_read(tsdn,
	    &emap->rtree, elm, /* dependent */ false);
	if (!extent_can_acquire_neighbor(edata, neighbor_contents, pai,
	    expected_state, forward, expanding)) {
		return NULL;
	}

	/* From this point, the neighbor edata can be safely acquired. */
	edata_t *neighbor = neighbor_contents.edata;
	assert(edata_state_get(neighbor) == expected_state);
	emap_update_edata_state(tsdn, emap, neighbor, extent_state_merging);
	if (expanding) {
		extent_assert_can_expand(edata, neighbor);
	} else {
		extent_assert_can_coalesce(edata, neighbor);
	}

	return neighbor;
}